

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O1

FinalizableICUObject<void_**,_&unum_close_70> *
Js::FinalizableICUObject<void_**,_&unum_close_70>::New(Recycler *recycler,void **resource)

{
  Recycler *alloc;
  FinalizableICUObject<void_**,_&unum_close_70> *pFVar1;
  undefined1 local_38 [8];
  TrackAllocData data;
  
  local_38 = (undefined1  [8])&FinalizableICUObject<void**,&unum_close_70>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_6708ef9;
  data.filename._0_4_ = 0x130;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_38);
  pFVar1 = (FinalizableICUObject<void_**,_&unum_close_70> *)
           new<Memory::Recycler>(0x10,alloc,0x3a2aea);
  (pFVar1->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_0150cc08;
  pFVar1->resource = resource;
  return pFVar1;
}

Assistant:

static FinalizableICUObject<TResource, CloseFunction> *New(Recycler *recycler, TResource resource)
        {
            return RecyclerNewFinalized(recycler, FinalizableICUObject, resource);
        }